

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CTypeID lj_ctype_intern(CTState *cts,CTInfo info,CTSize size)

{
  ushort uVar1;
  uint uVar2;
  CTypeID1 *pCVar3;
  CType *pCVar4;
  CTypeID1 *pCVar5;
  
  uVar2 = (size ^ info) - (size << 0xe | size >> 0x12);
  pCVar5 = cts->hash + ((size >> 0xd ^ uVar2) - (uVar2 >> 0x13) & 0x7f);
  pCVar3 = pCVar5;
  while( true ) {
    uVar1 = *pCVar3;
    if (uVar1 == 0) {
      uVar2 = cts->top;
      if (uVar2 < cts->sizetab) {
        pCVar4 = cts->tab;
      }
      else {
        if (0xffff < uVar2) {
          lj_err_msg(cts->L,LJ_ERR_TABOV);
        }
        pCVar4 = (CType *)lj_mem_grow(cts->L,cts->tab,&cts->sizetab,0x10000,0x10);
        cts->tab = pCVar4;
      }
      cts->top = uVar2 + 1;
      pCVar4[uVar2].info = info;
      pCVar4[uVar2].size = size;
      pCVar4[uVar2].sib = 0;
      pCVar4[uVar2].next = *pCVar5;
      pCVar4[uVar2].name.gcptr32 = 0;
      *pCVar5 = (ushort)uVar2;
      return uVar2;
    }
    pCVar4 = cts->tab;
    if ((pCVar4[uVar1].info == info) && (pCVar4[uVar1].size == size)) break;
    pCVar3 = &pCVar4[uVar1].next;
  }
  return (uint)uVar1;
}

Assistant:

CTypeID lj_ctype_intern(CTState *cts, CTInfo info, CTSize size)
{
  uint32_t h = ct_hashtype(info, size);
  CTypeID id = cts->hash[h];
  lua_assert(cts->L);
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (ct->info == info && ct->size == size)
      return id;
    id = ct->next;
  }
  id = cts->top;
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
  }
  cts->top = id+1;
  cts->tab[id].info = info;
  cts->tab[id].size = size;
  cts->tab[id].sib = 0;
  cts->tab[id].next = cts->hash[h];
  setgcrefnull(cts->tab[id].name);
  cts->hash[h] = (CTypeID1)id;
  return id;
}